

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<std::pair<QString,QString>>::emplace<std::pair<QString,QString>>
          (QMovableArrayOps<std::pair<QString,QString>> *this,qsizetype i,
          pair<QString,_QString> *args)

{
  undefined8 *puVar1;
  long lVar2;
  int *piVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  long lVar6;
  Data *pDVar7;
  char16_t *pcVar8;
  Data *pDVar9;
  char16_t *pcVar10;
  long lVar11;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  piVar3 = *(int **)this;
  if ((piVar3 == (int *)0x0) || (1 < *piVar3)) {
LAB_0026aa7e:
    pDVar7 = (args->first).d.d;
    pcVar8 = (args->first).d.ptr;
    (args->first).d.d = (Data *)0x0;
    (args->first).d.ptr = (char16_t *)0x0;
    qVar4 = (args->first).d.size;
    (args->first).d.size = 0;
    pDVar9 = (args->second).d.d;
    pcVar10 = (args->second).d.ptr;
    (args->second).d.d = (Data *)0x0;
    (args->second).d.ptr = (char16_t *)0x0;
    qVar5 = (args->second).d.size;
    (args->second).d.size = 0;
    lVar11 = *(long *)(this + 0x10);
    QArrayDataPointer<std::pair<QString,_QString>_>::detachAndGrow
              ((QArrayDataPointer<std::pair<QString,_QString>_> *)this,(uint)(i == 0 && lVar11 != 0)
               ,1,(pair<QString,_QString> **)0x0,
               (QArrayDataPointer<std::pair<QString,_QString>_> *)0x0);
    lVar6 = *(long *)(this + 8);
    if (i == 0 && lVar11 != 0) {
      *(Data **)(lVar6 + -0x30) = pDVar7;
      *(char16_t **)(lVar6 + -0x28) = pcVar8;
      *(qsizetype *)(lVar6 + -0x20) = qVar4;
      *(Data **)(lVar6 + -0x18) = pDVar9;
      *(char16_t **)(lVar6 + -0x10) = pcVar10;
      *(qsizetype *)(lVar6 + -8) = qVar5;
      *(long *)(this + 8) = lVar6 + -0x30;
    }
    else {
      puVar1 = (undefined8 *)(lVar6 + i * 0x30);
      memmove(puVar1 + 6,(void *)(lVar6 + i * 0x30),(*(long *)(this + 0x10) - i) * 0x30);
      *puVar1 = pDVar7;
      puVar1[1] = pcVar8;
      puVar1[2] = qVar4;
      puVar1[3] = pDVar9;
      puVar1[4] = pcVar10;
      puVar1[5] = qVar5;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  else {
    lVar11 = *(long *)(this + 0x10);
    if ((lVar11 == i && piVar3 != (int *)0x0) &&
       (*(long *)(piVar3 + 2) - lVar11 !=
        ((long)(*(long *)(this + 8) - ((long)piVar3 + 0x1fU & 0xfffffffffffffff0)) >> 4) *
        -0x5555555555555555)) {
      lVar6 = *(long *)(this + 8);
      lVar11 = lVar11 * 0x30;
      pDVar7 = (args->first).d.d;
      (args->first).d.d = (Data *)0x0;
      *(Data **)(lVar6 + lVar11) = pDVar7;
      pcVar8 = (args->first).d.ptr;
      (args->first).d.ptr = (char16_t *)0x0;
      *(char16_t **)(lVar6 + 8 + lVar11) = pcVar8;
      qVar4 = (args->first).d.size;
      (args->first).d.size = 0;
      *(qsizetype *)(lVar6 + 0x10 + lVar11) = qVar4;
      pDVar7 = (args->second).d.d;
      (args->second).d.d = (Data *)0x0;
      *(Data **)(lVar6 + 0x18 + lVar11) = pDVar7;
      pcVar8 = (args->second).d.ptr;
      (args->second).d.ptr = (char16_t *)0x0;
      *(char16_t **)(lVar6 + 0x20 + lVar11) = pcVar8;
      qVar4 = (args->second).d.size;
      (args->second).d.size = 0;
      *(qsizetype *)(lVar6 + 0x28 + lVar11) = qVar4;
    }
    else {
      if (((i != 0) || (piVar3 == (int *)0x0)) ||
         (((long)piVar3 + 0x1fU & 0xfffffffffffffff0) == *(ulong *)(this + 8))) goto LAB_0026aa7e;
      lVar11 = *(long *)(this + 8);
      pDVar7 = (args->first).d.d;
      (args->first).d.d = (Data *)0x0;
      *(Data **)(lVar11 + -0x30) = pDVar7;
      pcVar8 = (args->first).d.ptr;
      (args->first).d.ptr = (char16_t *)0x0;
      *(char16_t **)(lVar11 + -0x28) = pcVar8;
      qVar4 = (args->first).d.size;
      (args->first).d.size = 0;
      *(qsizetype *)(lVar11 + -0x20) = qVar4;
      pDVar7 = (args->second).d.d;
      (args->second).d.d = (Data *)0x0;
      *(Data **)(lVar11 + -0x18) = pDVar7;
      pcVar8 = (args->second).d.ptr;
      (args->second).d.ptr = (char16_t *)0x0;
      *(char16_t **)(lVar11 + -0x10) = pcVar8;
      qVar4 = (args->second).d.size;
      (args->second).d.size = 0;
      *(qsizetype *)(lVar11 + -8) = qVar4;
      *(long *)(this + 8) = *(long *)(this + 8) + -0x30;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }